

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testValidModelValidMultipleSoftmax_2(void)

{
  set<long,_std::less<long>,_std::allocator<long>_> *this;
  bool bVar1;
  NeuralNetwork *pNVar2;
  ostream *poVar3;
  undefined1 local_100 [8];
  Result res;
  set<long,_std::less<long>,_std::allocator<long>_> local_a8;
  undefined1 auStack_78 [8];
  TensorAttributes outTensorAttr;
  TensorAttributes inTensorAttr;
  NeuralNetwork *nn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&nn);
  buildBasicUpdatableNeuralNetworkModel((Model *)&nn);
  pNVar2 = addSoftmaxLayer((Model *)&nn,"softmax","B","softmax_out");
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            ((Model *)&nn,pNVar2,"cross_entropy_loss_layer","softmax_out","label_target");
  outTensorAttr._8_8_ = (long)"inner_layer_after_softmax_out" + 0x12;
  auStack_78 = (undefined1  [8])0x4c2992;
  outTensorAttr.name = (char *)0x1;
  addInnerProductLayer
            ((Model *)&nn,true,"inner_layer_after_softmax",
             (TensorAttributes *)&outTensorAttr.dimension,(TensorAttributes *)auStack_78,false,false
            );
  pNVar2 = addSoftmaxLayer((Model *)&nn,"softmax_2","inner_layer_after_softmax_out","softmax_2_out")
  ;
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (pNVar2,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_a8._M_t._M_impl._0_8_ = 0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_a8);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>(pNVar2,kSgdOptimizer,10,5,100,&local_a8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_a8);
  res.m_message.field_2._8_8_ = 0;
  this = (set<long,_std::less<long>,_std::allocator<long>_> *)((long)&res.m_message.field_2 + 8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(this);
  addEpochs<CoreML::Specification::NeuralNetwork>(pNVar2,100,1,100,this);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)((long)&res.m_message.field_2 + 8)
            );
  CoreML::Model::validate((Result *)local_100,(Model *)&nn);
  bVar1 = CoreML::Result::good((Result *)local_100);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x278);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"(res).good()");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  m._oneof_case_[0]._0_1_ = !bVar1;
  CoreML::Result::~Result((Result *)local_100);
  CoreML::Specification::Model::~Model((Model *)&nn);
  return m._oneof_case_[0];
}

Assistant:

int testValidModelValidMultipleSoftmax_2() {

    // This test creates the following model. This is a valid model. The first softmax is attached to CCE.
    // Second softmax is also valid. Although it is not attached to CCE, it is out of backpropagation scope.
    //     -----        --       -----       --
    //    |Dense| -- > |SM| --> |Dense| --> |SM|
    //     -----        --       -----       --
    //     updatable    |        updatable
    //                  |     ---
    //                   --> |CCE|
    //                        ---

    Specification::Model m;
    auto *nn = buildBasicUpdatableNeuralNetworkModel(m);

    // add a softmax layer
    nn = addSoftmaxLayer(m, "softmax", "B", "softmax_out");

    // attach a CCE loss layer to softmax
    addCategoricalCrossEntropyLoss(m, nn, "cross_entropy_loss_layer", "softmax_out", "label_target");

    // attch an updatable inner product layer to the softmax
    TensorAttributes inTensorAttr = { "softmax_out", 1 };
    TensorAttributes outTensorAttr = { "inner_layer_after_softmax_out", 1 };
    nn = addInnerProductLayer(m, true, "inner_layer_after_softmax", &inTensorAttr, &outTensorAttr);

    // add a second softmax layer
    nn = addSoftmaxLayer(m, "softmax_2", "inner_layer_after_softmax_out", "softmax_2_out");

    // now add an updatable model parameter.
    addLearningRate(nn, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(nn, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(nn, 100, 1, 100, std::set<int64_t>());

    Result res = Model::validate(m);
    ML_ASSERT_GOOD(res);
    return 0;
}